

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall
procxx::pipe_ostreambuf::pipe_ostreambuf
          (pipe_ostreambuf *this,size_t buffer_size,size_t put_back_size)

{
  size_type __n;
  reference pvVar1;
  value_type *end;
  size_t local_20;
  size_t put_back_size_local;
  size_t buffer_size_local;
  pipe_ostreambuf *this_local;
  
  local_20 = put_back_size;
  put_back_size_local = buffer_size;
  buffer_size_local = (size_t)this;
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__pipe_ostreambuf_002183a0;
  this->put_back_size_ = local_20;
  pipe_t::pipe_t(&this->stdout_pipe_);
  __n = put_back_size_local + local_20;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (&this->in_buffer_,__n,(allocator_type *)((long)&end + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&end + 3));
  pvVar1 = std::vector<char,_std::allocator<char>_>::back(&this->in_buffer_);
  std::streambuf::setg((char *)this,pvVar1 + 1,pvVar1 + 1);
  return;
}

Assistant:

pipe_ostreambuf(size_t buffer_size = 512, size_t put_back_size = 8)
      : put_back_size_{put_back_size}, in_buffer_(buffer_size + put_back_size) {
    auto end = &in_buffer_.back() + 1;
    setg(end, end, end);
  }